

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullReader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::NullReader::EndStep(NullReader *this)

{
  NullReaderImpl *pNVar1;
  allocator local_8c;
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  pNVar1 = (this->Impl)._M_t.
           super___uniq_ptr_impl<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::core::engine::NullReader::NullReaderImpl_*,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
           .super__Head_base<0UL,_adios2::core::engine::NullReader::NullReaderImpl_*,_false>.
           _M_head_impl;
  if (pNVar1->IsOpen == false) {
    std::__cxx11::string::string((string *)&local_28,"Engine",&local_89);
    std::__cxx11::string::string((string *)&local_48,"NullReader",&local_8a);
    std::__cxx11::string::string((string *)&local_68,"EndStep",&local_8b);
    std::__cxx11::string::string
              ((string *)&local_88,"NullReader::EndStep: Engine already closed",&local_8c);
    helper::Throw<std::runtime_error>(&local_28,&local_48,&local_68,&local_88,-1);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
    pNVar1 = (this->Impl)._M_t.
             super___uniq_ptr_impl<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_adios2::core::engine::NullReader::NullReaderImpl_*,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
             .super__Head_base<0UL,_adios2::core::engine::NullReader::NullReaderImpl_*,_false>.
             _M_head_impl;
  }
  if (pNVar1->IsInStep == false) {
    std::__cxx11::string::string((string *)&local_28,"Engine",&local_89);
    std::__cxx11::string::string((string *)&local_48,"NullReader",&local_8a);
    std::__cxx11::string::string((string *)&local_68,"EndStep",&local_8b);
    std::__cxx11::string::string
              ((string *)&local_88,"NullReader::EndStep: No active step",&local_8c);
    helper::Throw<std::runtime_error>(&local_28,&local_48,&local_68,&local_88,-1);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
    pNVar1 = (this->Impl)._M_t.
             super___uniq_ptr_impl<adios2::core::engine::NullReader::NullReaderImpl,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_adios2::core::engine::NullReader::NullReaderImpl_*,_std::default_delete<adios2::core::engine::NullReader::NullReaderImpl>_>
             .super__Head_base<0UL,_adios2::core::engine::NullReader::NullReaderImpl_*,_false>.
             _M_head_impl;
  }
  pNVar1->IsInStep = false;
  return;
}

Assistant:

void NullReader::EndStep()
{
    if (!Impl->IsOpen)
    {
        helper::Throw<std::runtime_error>("Engine", "NullReader", "EndStep",
                                          "NullReader::EndStep: Engine already closed");
    }

    if (!Impl->IsInStep)
    {
        helper::Throw<std::runtime_error>("Engine", "NullReader", "EndStep",
                                          "NullReader::EndStep: No active step");
    }

    Impl->IsInStep = false;
}